

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SpvBuilder.h
# Opt level: O0

CoherentFlags __thiscall
spv::Builder::AccessChain::CoherentFlags::operator|=(CoherentFlags *this,CoherentFlags *other)

{
  CoherentFlags *other_local;
  CoherentFlags *this_local;
  
  *(ushort *)this = *(ushort *)this & 0xfffe | *(ushort *)this & 1 | *(ushort *)other & 1;
  *(ushort *)this =
       *(ushort *)this & 0xfffd | (*(ushort *)this >> 1 & 1 | *(ushort *)other >> 1 & 1) << 1;
  *(ushort *)this =
       *(ushort *)this & 0xfffb | (*(ushort *)this >> 2 & 1 | *(ushort *)other >> 2 & 1) << 2;
  *(ushort *)this =
       *(ushort *)this & 0xfff7 | (*(ushort *)this >> 3 & 1 | *(ushort *)other >> 3 & 1) << 3;
  *(ushort *)this =
       *(ushort *)this & 0xffef | (*(ushort *)this >> 4 & 1 | *(ushort *)other >> 4 & 1) << 4;
  *(ushort *)this =
       *(ushort *)this & 0xffdf | (*(ushort *)this >> 5 & 1 | *(ushort *)other >> 5 & 1) << 5;
  *(ushort *)this =
       *(ushort *)this & 0xffbf | (*(ushort *)this >> 6 & 1 | *(ushort *)other >> 6 & 1) << 6;
  *(ushort *)this =
       *(ushort *)this & 0xff7f | (*(ushort *)this >> 7 & 1 | *(ushort *)other >> 7 & 1) << 7;
  *(ushort *)this = *(ushort *)this & 0xfeff | (*(ushort *)other >> 8 & 1) << 8;
  *(ushort *)this =
       *(ushort *)this & 0xfdff | (*(ushort *)this >> 9 & 1 | *(ushort *)other >> 9 & 1) << 9;
  *(ushort *)this =
       *(ushort *)this & 0xfbff | (*(ushort *)this >> 10 & 1 | *(ushort *)other >> 10 & 1) << 10;
  return *this;
}

Assistant:

CoherentFlags operator |=(const CoherentFlags &other) {
                coherent |= other.coherent;
                devicecoherent |= other.devicecoherent;
                queuefamilycoherent |= other.queuefamilycoherent;
                workgroupcoherent |= other.workgroupcoherent;
                subgroupcoherent |= other.subgroupcoherent;
                shadercallcoherent |= other.shadercallcoherent;
                nonprivate |= other.nonprivate;
                volatil |= other.volatil;
                nontemporal = other.nontemporal;
                isImage |= other.isImage;
                nonUniform |= other.nonUniform;
                return *this;
            }